

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O1

void __thiscall MyEntity::display(MyEntity *this,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Hello! My name is ",0x12);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,*(char **)&this->field_0x8,*(long *)&this->field_0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," !",2);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void display(std::ostream &os) const {
    os << "Hello! My name is " << getName() << " !" << std::endl;
  }